

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O3

bool __thiscall BmsParser::Parser::IsRandomStatement(Parser *this,char *str)

{
  string *str_00;
  char cVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  _Elt_pointer pbVar5;
  char *pcVar6;
  long lVar7;
  char *__s;
  string starttag;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (*str != '#') {
    return false;
  }
  __s = str + 1;
  lVar7 = 0;
  do {
    cVar1 = __s[lVar7];
    if (cVar1 == '\0') {
      pcVar6 = (char *)(this->key_)._M_string_length;
      strlen(__s);
LAB_00131c29:
      std::__cxx11::string::_M_replace((ulong)&this->key_,0,pcVar6,(ulong)__s);
      str_00 = &this->key_;
      BmsUtil::StringToUpper(str_00);
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 == 0) {
        return true;
      }
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 == 0) {
        return true;
      }
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 == 0) {
        return true;
      }
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)str_00);
        if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)str_00), iVar3 == 0)) ||
           (iVar3 = std::__cxx11::string::compare((char *)str_00), iVar3 == 0)) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->syntax_tag_,str_00);
          return true;
        }
        iVar3 = std::__cxx11::string::compare((char *)str_00);
        if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)str_00), iVar3 != 0)) {
          sVar4 = std::
                  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->syntax_tag_);
          return sVar4 != 0;
        }
        sVar4 = std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->syntax_tag_);
        if (sVar4 == 0) {
          WriteLogLine(this,"%d line - end tag without start tag",(ulong)(uint)this->line_);
          this->panic_ = true;
          return false;
        }
        pbVar5 = (this->syntax_tag_).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pbVar5 == (this->syntax_tag_).
                      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar5 = (this->syntax_tag_).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        pcVar2 = pbVar5[-1]._M_dataplus._M_p;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,pcVar2,pcVar2 + pbVar5[-1]._M_string_length);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&this->syntax_tag_);
        iVar3 = std::__cxx11::string::compare((char *)str_00);
        if ((((iVar3 != 0) || (iVar3 = std::__cxx11::string::compare((char *)local_48), iVar3 != 0))
            && ((iVar3 = std::__cxx11::string::compare((char *)str_00), iVar3 != 0 ||
                (iVar3 = std::__cxx11::string::compare((char *)local_48), iVar3 != 0)))) &&
           ((iVar3 = std::__cxx11::string::compare((char *)str_00), iVar3 != 0 ||
            (iVar3 = std::__cxx11::string::compare((char *)local_48), iVar3 != 0)))) {
          WriteLogLine(this,"%d line - start ~ end tag doesn\'t match.",(ulong)(uint)this->line_);
          this->panic_ = true;
        }
        if (local_48[0] == local_38) {
          return true;
        }
        operator_delete(local_48[0]);
        return true;
      }
      return true;
    }
    if ((cVar1 == '\t') || (cVar1 == ' ')) {
      pcVar6 = (char *)(this->key_)._M_string_length;
      goto LAB_00131c29;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

bool IsComment(const char* str) {
			return *str != '#' || !*str;
		}